

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_make_public
              (mbedtls_dhm_context *ctx,int x_size,uchar *output,size_t olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  int local_48;
  int local_44;
  int count;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t olen_local;
  uchar *output_local;
  int x_size_local;
  mbedtls_dhm_context *ctx_local;
  
  local_48 = 0;
  if ((olen == 0) || (ctx->len < olen)) {
    ctx_local._4_4_ = -0x3080;
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(&ctx->P,0);
    if (iVar1 == 0) {
      ctx_local._4_4_ = -0x3080;
    }
    else {
      do {
        local_44 = mbedtls_mpi_fill_random(&ctx->X,(long)x_size,f_rng,p_rng);
        while( true ) {
          if (local_44 != 0) goto LAB_0010daa3;
          iVar1 = mbedtls_mpi_cmp_mpi(&ctx->X,&ctx->P);
          if (iVar1 < 0) break;
          local_44 = mbedtls_mpi_shift_r(&ctx->X,1);
        }
        if (10 < local_48) {
          return -0x3280;
        }
        iVar1 = dhm_check_range(&ctx->X,&ctx->P);
        local_48 = local_48 + 1;
      } while (iVar1 != 0);
      local_44 = mbedtls_mpi_exp_mod(&ctx->GX,&ctx->G,&ctx->X,&ctx->P,&ctx->RP);
      if (local_44 == 0) {
        iVar1 = dhm_check_range(&ctx->GX,&ctx->P);
        if (iVar1 != 0) {
          return iVar1;
        }
        local_44 = mbedtls_mpi_write_binary(&ctx->GX,output,olen);
      }
LAB_0010daa3:
      if (local_44 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        ctx_local._4_4_ = local_44 + -0x3280;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_dhm_make_public( mbedtls_dhm_context *ctx, int x_size,
                     unsigned char *output, size_t olen,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret, count = 0;
    DHM_VALIDATE_RET( ctx != NULL );
    DHM_VALIDATE_RET( output != NULL );
    DHM_VALIDATE_RET( f_rng != NULL );

    if( olen < 1 || olen > ctx->len )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( mbedtls_mpi_cmp_int( &ctx->P, 0 ) == 0 )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    /*
     * generate X and calculate GX = G^X mod P
     */
    do
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( &ctx->X, x_size, f_rng, p_rng ) );

        while( mbedtls_mpi_cmp_mpi( &ctx->X, &ctx->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &ctx->X, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED );
    }
    while( dhm_check_range( &ctx->X, &ctx->P ) != 0 );

    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->GX, &ctx->G, &ctx->X,
                          &ctx->P , &ctx->RP ) );

    if( ( ret = dhm_check_range( &ctx->GX, &ctx->P ) ) != 0 )
        return( ret );

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->GX, output, olen ) );

cleanup:

    if( ret != 0 )
        return( MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED + ret );

    return( 0 );
}